

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_function_args_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,TextureFunctionArguments *args,
          bool *p_forward)

{
  uint32_t id;
  uint32_t uVar1;
  Dim DVar2;
  uint id_00;
  bool bVar3;
  char cVar4;
  undefined4 uVar5;
  long lVar6;
  undefined7 extraout_var;
  SPIRType *pSVar7;
  char *pcVar8;
  CompilerError *this_00;
  SPIRType *pSVar9;
  CompilerGLSL *pCVar10;
  string *in_R8;
  char (*in_R9) [2];
  char *pcVar11;
  byte bVar12;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 uVar13;
  char cVar14;
  undefined1 local_1f0 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> coord_expr;
  string local_1a8;
  SPIRType expected_type;
  
  id = (args->base).img.id;
  local_1f0._32_8_ = (args->base).imgtype;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((args->base).is_fetch == true) {
    convert_separate_image_to_expression_abi_cxx11_((string *)&expected_type,this,id);
  }
  else {
    to_non_uniform_aware_expression_abi_cxx11_((string *)&expected_type,this,id);
  }
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&expected_type);
  ::std::__cxx11::string::~string((string *)&expected_type);
  if ((args->nonuniform_expression == true) &&
     (lVar6 = ::std::__cxx11::string::find((char)__return_storage_ptr__,0x5b), lVar6 != -1)) {
    in_R8 = (string *)0x37f234;
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              ((string *)&expected_type,(spirv_cross *)&(this->backend).nonuniform_qualifier,
               (char **)0x3965df,(char (*) [2])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37f234,in_R9);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&expected_type);
    ::std::__cxx11::string::~string((string *)&expected_type);
  }
  uVar13 = CONCAT13((this->backend).swizzle_is_function,(int3)in_stack_fffffffffffffe0c);
  bVar3 = should_forward(this,args->coord);
  uVar5 = (undefined4)CONCAT71(extraout_var,bVar3);
  uVar1 = args->coord_components;
  pSVar7 = Compiler::expression_type(&this->super_Compiler,args->coord);
  pcVar11 = "";
  if (uVar1 != pSVar7->vecsize) {
    if (uVar1 == 1) {
      pcVar11 = ".x";
    }
    else {
      if (uVar1 == 3) {
        pcVar8 = ".xyz()";
        pcVar11 = ".xyz";
      }
      else {
        if (uVar1 != 2) goto LAB_0025bc7d;
        pcVar8 = ".xy()";
        pcVar11 = ".xy";
      }
      if ((char)((uint)uVar13 >> 0x18) != '\0') {
        pcVar11 = pcVar8;
      }
    }
  }
LAB_0025bc7d:
  if (*pcVar11 == '\0') {
    to_expression_abi_cxx11_(&coord_expr,this,args->coord,true);
  }
  else {
    to_enclosed_expression_abi_cxx11_((string *)&expected_type,this,args->coord,true);
    ::std::operator+(&coord_expr,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &expected_type,pcVar11);
    ::std::__cxx11::string::~string((string *)&expected_type);
  }
  pSVar7 = Compiler::expression_type(&this->super_Compiler,args->coord);
  if (*(int *)&(pSVar7->super_IVariant).field_0xc == 8) {
    SPIRType::SPIRType(&expected_type,pSVar7);
    expected_type.vecsize = args->coord_components;
    expected_type.super_IVariant._12_4_ = 7;
    in_R8 = &coord_expr;
    bitcast_expression((string *)local_1f0,this,&expected_type,
                       *(BaseType *)&(pSVar7->super_IVariant).field_0xc,in_R8);
    ::std::__cxx11::string::operator=((string *)&coord_expr,(string *)local_1f0);
    ::std::__cxx11::string::~string((string *)local_1f0);
    SPIRType::~SPIRType(&expected_type);
  }
  pSVar9 = (SPIRType *)local_1f0._32_8_;
  DVar2 = ((ImageType *)(local_1f0._32_8_ + 0xf8))->dim;
  if (((byte)(DVar2 == DimCube | DVar2 == Dim2D & ((ImageType *)(local_1f0._32_8_ + 0xf8))->arrayed)
       == 1) &&
     (bVar3 = Compiler::is_depth_image(&this->super_Compiler,(SPIRType *)local_1f0._32_8_,id),
     bVar3 && args->lod != 0)) {
    bVar12 = (args->base).is_fetch ^ 1;
  }
  else {
    bVar12 = 0;
  }
  id_00 = args->dref;
  pCVar10 = (CompilerGLSL *)(ulong)id_00;
  if (id_00 == 0) {
    if ((((ImageType *)((long)pSVar9 + 0xf8))->dim == Dim1D) && ((this->options).es == true)) {
      bVar3 = ((ImageType *)((long)pSVar9 + 0xf8))->arrayed;
      if (*(int *)&(pSVar7->super_IVariant).field_0xc - 0xcU < 3) {
        if ((bVar3 == false) && ((args->base).is_proj != true)) {
          join<char_const(&)[6],std::__cxx11::string&,char_const(&)[7]>
                    ((string *)&expected_type,(spirv_cross *)0x37dce5,(char (*) [6])&coord_expr,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", 0.0)",
                     (char (*) [7])in_R8);
          goto LAB_0025c353;
        }
        enclose_expression((string *)local_1f0,pCVar10,&coord_expr);
        enclose_expression(&local_1a8,pCVar10,&coord_expr);
        join<char_const(&)[6],std::__cxx11::string,char_const(&)[10],std::__cxx11::string,char_const(&)[4]>
                  ((string *)&expected_type,(spirv_cross *)0x37bf58,(char (*) [6])local_1f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".x, 0.0, ",
                   (char (*) [10])&local_1a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x383db2,
                   (char (*) [4])CONCAT44(uVar13,uVar5));
LAB_0025c2cb:
        ::std::__cxx11::string::operator=((string *)&coord_expr,(string *)&expected_type);
        ::std::__cxx11::string::~string((string *)&expected_type);
        ::std::__cxx11::string::~string((string *)&local_1a8);
        pSVar7 = (SPIRType *)local_1f0;
      }
      else {
        if (bVar3 != false) {
          enclose_expression((string *)local_1f0,pCVar10,&coord_expr);
          enclose_expression(&local_1a8,pCVar10,&coord_expr);
          join<char_const(&)[7],std::__cxx11::string,char_const(&)[8],std::__cxx11::string,char_const(&)[4]>
                    ((string *)&expected_type,(spirv_cross *)"ivec3(",(char (*) [7])local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".x, 0, ",
                     (char (*) [8])&local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x383db2,
                     (char (*) [4])CONCAT44(uVar13,uVar5));
          goto LAB_0025c2cb;
        }
        join<char_const(&)[7],std::__cxx11::string&,char_const(&)[5]>
                  ((string *)&expected_type,(spirv_cross *)"ivec2(",(char (*) [7])&coord_expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37e0e5,
                   (char (*) [5])in_R8);
LAB_0025c353:
        pSVar7 = &expected_type;
        ::std::__cxx11::string::operator=((string *)&coord_expr,(string *)pSVar7);
      }
      ::std::__cxx11::string::~string((string *)pSVar7);
      pSVar9 = (SPIRType *)local_1f0._32_8_;
    }
    cVar4 = (char)uVar5;
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    if ((char)uVar5 == '\0') {
      cVar4 = false;
    }
    else {
      cVar4 = should_forward(this,id_00);
    }
    cVar14 = (char)((uint)uVar13 >> 0x18);
    if (((args->base).is_gather == false) && (args->coord_components != 4)) {
      if ((args->base).is_proj != true) {
        pSVar7 = Compiler::expression_type(&this->super_Compiler,args->coord);
        SPIRType::SPIRType(&expected_type,pSVar7);
        expected_type.vecsize = args->coord_components + 1;
        if ((((ImageType *)((long)pSVar9 + 0xf8))->dim == Dim1D) && ((this->options).es == true)) {
          expected_type.vecsize = args->coord_components + 2;
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        type_to_glsl_constructor_abi_cxx11_((string *)local_1f0,this,&expected_type);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)local_1f0);
        pCVar10 = (CompilerGLSL *)0x3965df;
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        if ((((ImageType *)((long)pSVar9 + 0xf8))->dim == Dim1D) && ((this->options).es == true)) {
          if (((ImageType *)((long)pSVar9 + 0xf8))->arrayed == true) {
            enclose_expression(&local_1a8,pCVar10,&coord_expr);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1f0,&local_1a8,".x");
            ::std::__cxx11::string::append((string *)__return_storage_ptr__);
            ::std::__cxx11::string::~string((string *)local_1f0);
            ::std::__cxx11::string::~string((string *)&local_1a8);
            pCVar10 = (CompilerGLSL *)0x37bf48;
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            enclose_expression(&local_1a8,pCVar10,&coord_expr);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1f0,&local_1a8,".y");
            ::std::__cxx11::string::append((string *)__return_storage_ptr__);
            ::std::__cxx11::string::~string((string *)local_1f0);
            ::std::__cxx11::string::~string((string *)&local_1a8);
          }
          else {
            ::std::__cxx11::string::append((string *)__return_storage_ptr__);
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
        }
        else {
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_expression_abi_cxx11_((string *)local_1f0,this,args->dref,true);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)local_1f0);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        SPIRType::~SPIRType(&expected_type);
        goto LAB_0025c38e;
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      DVar2 = ((ImageType *)((long)pSVar9 + 0xf8))->dim;
      if (DVar2 == Dim2D) {
        to_enclosed_expression_abi_cxx11_((string *)local_1f0,this,args->coord,true);
        pcVar11 = ".xy";
        if (cVar14 != '\0') {
          pcVar11 = ".xy()";
        }
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &expected_type,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f0,pcVar11);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&expected_type);
        ::std::__cxx11::string::~string((string *)local_1f0);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_expression_abi_cxx11_((string *)&expected_type,this,args->dref,true);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&expected_type);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_enclosed_expression_abi_cxx11_((string *)local_1f0,this,args->coord,true);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &expected_type,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f0,".z)");
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      else {
        if (DVar2 != Dim1D) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&expected_type,"Invalid type for textureProj with shadow.",
                     (allocator *)local_1f0);
          CompilerError::CompilerError(this_00,(string *)&expected_type);
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        to_enclosed_expression_abi_cxx11_((string *)local_1f0,this,args->coord,true);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &expected_type,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f0,".x");
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&expected_type);
        ::std::__cxx11::string::~string((string *)local_1f0);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_expression_abi_cxx11_((string *)&expected_type,this,args->dref,true);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&expected_type);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_enclosed_expression_abi_cxx11_((string *)local_1f0,this,args->coord,true);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &expected_type,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f0,".y)");
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      ::std::__cxx11::string::~string((string *)&expected_type);
      pSVar7 = (SPIRType *)local_1f0;
    }
    else {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      to_expression_abi_cxx11_((string *)&expected_type,this,args->coord,true);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&expected_type);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      to_expression_abi_cxx11_((string *)&expected_type,this,args->dref,true);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      pSVar7 = &expected_type;
    }
    ::std::__cxx11::string::~string((string *)pSVar7);
  }
LAB_0025c38e:
  if (args->grad_y != 0 || args->grad_x != 0) {
    if ((cVar4 == '\0') || (bVar3 = should_forward(this,args->grad_x), !bVar3)) {
      cVar4 = false;
    }
    else {
      cVar4 = should_forward(this,args->grad_y);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)&expected_type,this,args->grad_x,true);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&expected_type);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)&expected_type,this,args->grad_y,true);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&expected_type);
  }
  if (args->lod == 0) {
    if ((((args->base).is_fetch == true) && ((pSVar9->image).dim != DimBuffer)) &&
       ((pSVar9->image).ms == false)) {
LAB_0025c515:
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  else if (bVar12 == 0) {
    if (cVar4 == '\0') {
      cVar4 = false;
    }
    else {
      cVar4 = should_forward(this,args->lod);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    if ((((args->base).is_fetch == true) && ((pSVar9->image).dim != DimBuffer)) &&
       ((pSVar9->image).ms == false)) {
      bitcast_expression_abi_cxx11_((string *)&expected_type,this,Int,args->lod);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      to_expression_abi_cxx11_((string *)&expected_type,this,args->lod,true);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    ::std::__cxx11::string::~string((string *)&expected_type);
  }
  else {
    DVar2 = (pSVar9->image).dim;
    if ((DVar2 == Dim2D) || (DVar2 == DimCube)) goto LAB_0025c515;
  }
  if (args->coffset == 0) {
    if (args->offset == 0) goto LAB_0025c5d1;
    if (cVar4 == '\0') {
      cVar4 = false;
    }
    else {
      cVar4 = should_forward(this,args->offset);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    bitcast_expression_abi_cxx11_((string *)&expected_type,this,Int,args->offset);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    if (cVar4 == '\0') {
      cVar4 = false;
    }
    else {
      cVar4 = should_forward(this,args->coffset);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    bitcast_expression_abi_cxx11_((string *)&expected_type,this,Int,args->coffset);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::~string((string *)&expected_type);
LAB_0025c5d1:
  if (args->sample != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    bitcast_expression_abi_cxx11_((string *)&expected_type,this,Int,args->sample);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&expected_type);
  }
  if (args->min_lod != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)&expected_type,this,args->min_lod,true);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&expected_type);
  }
  if (args->sparse_texel != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)&expected_type,this,args->sparse_texel,true);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&expected_type);
  }
  if (args->bias != 0) {
    if (cVar4 == '\0') {
      cVar4 = false;
    }
    else {
      cVar4 = should_forward(this,args->bias);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)&expected_type,this,args->bias,true);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&expected_type);
  }
  if ((args->component != 0) && (bVar3 = expression_is_constant_null(this,args->component), !bVar3))
  {
    if (cVar4 == '\0') {
      cVar4 = false;
    }
    else {
      cVar4 = should_forward(this,args->component);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    bitcast_expression_abi_cxx11_((string *)&expected_type,this,Int,args->component);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&expected_type);
  }
  *p_forward = (bool)cVar4;
  ::std::__cxx11::string::~string((string *)&coord_expr);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_function_args(const TextureFunctionArguments &args, bool *p_forward)
{
	VariableID img = args.base.img;
	auto &imgtype = *args.base.imgtype;

	string farg_str;
	if (args.base.is_fetch)
		farg_str = convert_separate_image_to_expression(img);
	else
		farg_str = to_non_uniform_aware_expression(img);

	if (args.nonuniform_expression && farg_str.find_first_of('[') != string::npos)
	{
		// Only emit nonuniformEXT() wrapper if the underlying expression is arrayed in some way.
		farg_str = join(backend.nonuniform_qualifier, "(", farg_str, ")");
	}

	bool swizz_func = backend.swizzle_is_function;
	auto swizzle = [swizz_func](uint32_t comps, uint32_t in_comps) -> const char * {
		if (comps == in_comps)
			return "";

		switch (comps)
		{
		case 1:
			return ".x";
		case 2:
			return swizz_func ? ".xy()" : ".xy";
		case 3:
			return swizz_func ? ".xyz()" : ".xyz";
		default:
			return "";
		}
	};

	bool forward = should_forward(args.coord);

	// The IR can give us more components than we need, so chop them off as needed.
	auto swizzle_expr = swizzle(args.coord_components, expression_type(args.coord).vecsize);
	// Only enclose the UV expression if needed.
	auto coord_expr =
	    (*swizzle_expr == '\0') ? to_expression(args.coord) : (to_enclosed_expression(args.coord) + swizzle_expr);

	// texelFetch only takes int, not uint.
	auto &coord_type = expression_type(args.coord);
	if (coord_type.basetype == SPIRType::UInt)
	{
		auto expected_type = coord_type;
		expected_type.vecsize = args.coord_components;
		expected_type.basetype = SPIRType::Int;
		coord_expr = bitcast_expression(expected_type, coord_type.basetype, coord_expr);
	}

	// textureLod on sampler2DArrayShadow and samplerCubeShadow does not exist in GLSL for some reason.
	// To emulate this, we will have to use textureGrad with a constant gradient of 0.
	// The workaround will assert that the LOD is in fact constant 0, or we cannot emit correct code.
	// This happens for HLSL SampleCmpLevelZero on Texture2DArray and TextureCube.
	bool workaround_lod_array_shadow_as_grad =
	    ((imgtype.image.arrayed && imgtype.image.dim == Dim2D) || imgtype.image.dim == DimCube) &&
	    is_depth_image(imgtype, img) && args.lod != 0 && !args.base.is_fetch;

	if (args.dref)
	{
		forward = forward && should_forward(args.dref);

		// SPIR-V splits dref and coordinate.
		if (args.base.is_gather ||
		    args.coord_components == 4) // GLSL also splits the arguments in two. Same for textureGather.
		{
			farg_str += ", ";
			farg_str += to_expression(args.coord);
			farg_str += ", ";
			farg_str += to_expression(args.dref);
		}
		else if (args.base.is_proj)
		{
			// Have to reshuffle so we get vec4(coord, dref, proj), special case.
			// Other shading languages splits up the arguments for coord and compare value like SPIR-V.
			// The coordinate type for textureProj shadow is always vec4 even for sampler1DShadow.
			farg_str += ", vec4(";

			if (imgtype.image.dim == Dim1D)
			{
				// Could reuse coord_expr, but we will mess up the temporary usage checking.
				farg_str += to_enclosed_expression(args.coord) + ".x";
				farg_str += ", ";
				farg_str += "0.0, ";
				farg_str += to_expression(args.dref);
				farg_str += ", ";
				farg_str += to_enclosed_expression(args.coord) + ".y)";
			}
			else if (imgtype.image.dim == Dim2D)
			{
				// Could reuse coord_expr, but we will mess up the temporary usage checking.
				farg_str += to_enclosed_expression(args.coord) + (swizz_func ? ".xy()" : ".xy");
				farg_str += ", ";
				farg_str += to_expression(args.dref);
				farg_str += ", ";
				farg_str += to_enclosed_expression(args.coord) + ".z)";
			}
			else
				SPIRV_CROSS_THROW("Invalid type for textureProj with shadow.");
		}
		else
		{
			// Create a composite which merges coord/dref into a single vector.
			auto type = expression_type(args.coord);
			type.vecsize = args.coord_components + 1;
			if (imgtype.image.dim == Dim1D && options.es)
				type.vecsize++;
			farg_str += ", ";
			farg_str += type_to_glsl_constructor(type);
			farg_str += "(";

			if (imgtype.image.dim == Dim1D && options.es)
			{
				if (imgtype.image.arrayed)
				{
					farg_str += enclose_expression(coord_expr) + ".x";
					farg_str += ", 0.0, ";
					farg_str += enclose_expression(coord_expr) + ".y";
				}
				else
				{
					farg_str += coord_expr;
					farg_str += ", 0.0";
				}
			}
			else
				farg_str += coord_expr;

			farg_str += ", ";
			farg_str += to_expression(args.dref);
			farg_str += ")";
		}
	}
	else
	{
		if (imgtype.image.dim == Dim1D && options.es)
		{
			// Have to fake a second coordinate.
			if (type_is_floating_point(coord_type))
			{
				// Cannot mix proj and array.
				if (imgtype.image.arrayed || args.base.is_proj)
				{
					coord_expr = join("vec3(", enclose_expression(coord_expr), ".x, 0.0, ",
					                  enclose_expression(coord_expr), ".y)");
				}
				else
					coord_expr = join("vec2(", coord_expr, ", 0.0)");
			}
			else
			{
				if (imgtype.image.arrayed)
				{
					coord_expr = join("ivec3(", enclose_expression(coord_expr),
									  ".x, 0, ",
									  enclose_expression(coord_expr), ".y)");
				}
				else
					coord_expr = join("ivec2(", coord_expr, ", 0)");
			}
		}

		farg_str += ", ";
		farg_str += coord_expr;
	}

	if (args.grad_x || args.grad_y)
	{
		forward = forward && should_forward(args.grad_x);
		forward = forward && should_forward(args.grad_y);
		farg_str += ", ";
		farg_str += to_expression(args.grad_x);
		farg_str += ", ";
		farg_str += to_expression(args.grad_y);
	}

	if (args.lod)
	{
		if (workaround_lod_array_shadow_as_grad)
		{
			// Implement textureGrad() instead. LOD == 0.0 is implemented as gradient of 0.0.
			// Implementing this as plain texture() is not safe on some implementations.
			if (imgtype.image.dim == Dim2D)
				farg_str += ", vec2(0.0), vec2(0.0)";
			else if (imgtype.image.dim == DimCube)
				farg_str += ", vec3(0.0), vec3(0.0)";
		}
		else
		{
			forward = forward && should_forward(args.lod);
			farg_str += ", ";

			// Lod expression for TexelFetch in GLSL must be int, and only int.
			if (args.base.is_fetch && imgtype.image.dim != DimBuffer && !imgtype.image.ms)
				farg_str += bitcast_expression(SPIRType::Int, args.lod);
			else
				farg_str += to_expression(args.lod);
		}
	}
	else if (args.base.is_fetch && imgtype.image.dim != DimBuffer && !imgtype.image.ms)
	{
		// Lod argument is optional in OpImageFetch, but we require a LOD value, pick 0 as the default.
		farg_str += ", 0";
	}

	if (args.coffset)
	{
		forward = forward && should_forward(args.coffset);
		farg_str += ", ";
		farg_str += bitcast_expression(SPIRType::Int, args.coffset);
	}
	else if (args.offset)
	{
		forward = forward && should_forward(args.offset);
		farg_str += ", ";
		farg_str += bitcast_expression(SPIRType::Int, args.offset);
	}

	if (args.sample)
	{
		farg_str += ", ";
		farg_str += bitcast_expression(SPIRType::Int, args.sample);
	}

	if (args.min_lod)
	{
		farg_str += ", ";
		farg_str += to_expression(args.min_lod);
	}

	if (args.sparse_texel)
	{
		// Sparse texel output parameter comes after everything else, except it's before the optional, component/bias arguments.
		farg_str += ", ";
		farg_str += to_expression(args.sparse_texel);
	}

	if (args.bias)
	{
		forward = forward && should_forward(args.bias);
		farg_str += ", ";
		farg_str += to_expression(args.bias);
	}

	if (args.component && !expression_is_constant_null(args.component))
	{
		forward = forward && should_forward(args.component);
		farg_str += ", ";
		farg_str += bitcast_expression(SPIRType::Int, args.component);
	}

	*p_forward = forward;

	return farg_str;
}